

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ExpandDimsLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_expanddims(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x465) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x465;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    ExpandDimsLayerParams::ExpandDimsLayerParams(this_00.expanddims_);
    (this->layer_).expanddims_ = (ExpandDimsLayerParams *)this_00;
  }
  return (ExpandDimsLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ExpandDimsLayerParams* NeuralNetworkLayer::mutable_expanddims() {
  if (!has_expanddims()) {
    clear_layer();
    set_has_expanddims();
    layer_.expanddims_ = new ::CoreML::Specification::ExpandDimsLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.expandDims)
  return layer_.expanddims_;
}